

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

result_type __thiscall
pstore::serialize::archive::details::database_writer_policy::put<unsigned_long>
          (database_writer_policy *this,unsigned_long *value)

{
  typed_address<unsigned_long> tVar1;
  shared_ptr<unsigned_long> ptr;
  typed_address<unsigned_long> addr;
  pair<std::shared_ptr<unsigned_long>,_pstore::typed_address<unsigned_long>_> local_40;
  typed_address<unsigned_long> *local_28;
  undefined1 *local_20;
  
  ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addr.a_.a_ = (address)0;
  transaction_base::alloc_rw<unsigned_long,void>(&local_40,this->transaction_,1);
  local_28 = &addr;
  local_20 = (undefined1 *)&ptr;
  std::tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&>::operator=
            ((tuple<std::shared_ptr<unsigned_long>&,pstore::typed_address<unsigned_long>&> *)
             &local_28,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.first.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tVar1 = addr;
  *ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr = *value;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (result_type)(value_type)tVar1.a_.a_;
}

Assistant:

auto put (Ty const & value) -> result_type {
                        std::shared_ptr<Ty> ptr;
                        auto addr = typed_address<Ty>::null ();
                        std::tie (ptr, addr) = transaction_.template alloc_rw<Ty> ();
                        *ptr = value;
                        return addr.to_address ();
                    }